

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O1

bool CorUnix::InternalTryEnterCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  int iVar1;
  uint uVar2;
  HANDLE pVVar3;
  PVOID pvVar4;
  char *callingFuncName;
  bool bVar5;
  
  callingFuncName = (char *)pCriticalSection;
  if (pCriticalSection->dwInitState == 0) {
    fprintf(_stderr,"] %s %s:%d","InternalTryEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x3ec);
    callingFuncName = "Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n";
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar3 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,callingFuncName);
  LOCK();
  uVar2 = pCriticalSection->LockCount;
  bVar5 = uVar2 == 0;
  if (bVar5) {
    pCriticalSection->LockCount = 1;
    uVar2 = 0;
  }
  UNLOCK();
  if (bVar5) {
    pCriticalSection->OwningThread = pVVar3;
    pCriticalSection->RecursionCount = 1;
    pvVar4 = pCriticalSection->DebugInfo;
    if (pvVar4 == (PVOID)0x0) {
      return true;
    }
    *(int *)((long)pvVar4 + 0x18) = *(int *)((long)pvVar4 + 0x18) + 1;
    pvVar4 = pCriticalSection->DebugInfo;
    iVar1 = *(int *)((long)pvVar4 + 0x1c);
  }
  else {
    if (((uVar2 & 1) == 0) || (pCriticalSection->OwningThread != pVVar3)) {
      return false;
    }
    pCriticalSection->RecursionCount = pCriticalSection->RecursionCount + 1;
    pvVar4 = pCriticalSection->DebugInfo;
    if (pvVar4 == (PVOID)0x0) {
      return true;
    }
    iVar1 = *(int *)((long)pvVar4 + 0x1c);
  }
  *(int *)((long)pvVar4 + 0x1c) = iVar1 + 1;
  return true;
}

Assistant:

bool InternalTryEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

        LONG lNewVal;
        SIZE_T threadId;
        bool fRet = true;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);

        lNewVal = InterlockedCompareExchange (&pPalCriticalSection->LockCount,
                                             (LONG)PALCS_LOCK_BIT,
                                             (LONG)PALCS_LOCK_INIT);
        if (lNewVal == PALCS_LOCK_INIT)
        {
            // CS successfully acquired: setting ownership data
            pPalCriticalSection->OwningThread = threadId;
            pPalCriticalSection->RecursionCount = 1;
#ifdef _DEBUG
            if (NULL != pPalCriticalSection->DebugInfo)
            {
                pPalCriticalSection->DebugInfo->lAcquireCount += 1;
                pPalCriticalSection->DebugInfo->lEnterCount += 1;
            }
#endif // _DEBUG

            goto ITECS_exit;
        }

        // check if the current thread already owns the criticalSection
        if ((lNewVal & PALCS_LOCK_BIT) &&
            (pPalCriticalSection->OwningThread == threadId))
        {
            pPalCriticalSection->RecursionCount += 1;
#ifdef _DEBUG
            if (NULL != pPalCriticalSection->DebugInfo)
            {
                pPalCriticalSection->DebugInfo->lEnterCount += 1;
            }
#endif // _DEBUG

            goto ITECS_exit;
        }

        // Failed to acquire the CS
        fRet = false;

    ITECS_exit:
        return fRet;
    }